

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void deleteTable(sqlite3 *db,Table *pTable)

{
  Index *pIVar1;
  FKey *pFVar2;
  VTable *pVVar3;
  sqlite3 *psVar4;
  VTable *pVVar5;
  void *p_00;
  FKey *pFVar6;
  Select *p_01;
  FKey *pFVar7;
  void *p;
  Index *p_02;
  long lVar8;
  
  p_02 = pTable->pIndex;
  while (p_02 != (Index *)0x0) {
    pIVar1 = p_02->pNext;
    if (((db == (sqlite3 *)0x0) || (db->pnBytesFreed == (int *)0x0)) && (pTable->eTabType != '\x01')
       ) {
      sqlite3HashInsert(&p_02->pSchema->idxHash,p_02->zName,(void *)0x0);
    }
    sqlite3FreeIndex(db,p_02);
    p_02 = pIVar1;
  }
  if (pTable->eTabType == '\x01') {
    if ((db == (sqlite3 *)0x0) || (db->pnBytesFreed == (int *)0x0)) {
      pVVar3 = (pTable->u).vtab.p;
      (pTable->u).tab.pDfltList = (ExprList *)0x0;
      while (pVVar3 != (VTable *)0x0) {
        psVar4 = pVVar3->db;
        pVVar5 = pVVar3->pNext;
        if (psVar4 == (sqlite3 *)0x0) {
          (pTable->u).vtab.p = pVVar3;
          pVVar3->pNext = (VTable *)0x0;
          pVVar3 = pVVar5;
        }
        else {
          pVVar3->pNext = psVar4->pDisconnect;
          psVar4->pDisconnect = pVVar3;
          pVVar3 = pVVar5;
        }
      }
    }
    if ((pTable->u).tab.pFKey != (FKey *)0x0) {
      if (0 < (pTable->u).tab.addColOffset) {
        lVar8 = 0;
        do {
          if ((lVar8 != 1) &&
             (p_00 = *(void **)(((pTable->u).tab.pFKey)->aAction + lVar8 * 8 + -0x2d),
             p_00 != (void *)0x0)) {
            sqlite3DbFreeNN(db,p_00);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < (pTable->u).tab.addColOffset);
      }
      pFVar6 = (pTable->u).tab.pFKey;
      if (pFVar6 != (FKey *)0x0) {
        sqlite3DbFreeNN(db,pFVar6);
      }
    }
  }
  else if (pTable->eTabType == '\0') {
    pFVar6 = (pTable->u).tab.pFKey;
    while (pFVar6 != (FKey *)0x0) {
      if ((db == (sqlite3 *)0x0) || (db->pnBytesFreed == (int *)0x0)) {
        pFVar2 = pFVar6->pNextTo;
        if (pFVar6->pPrevTo == (FKey *)0x0) {
          pFVar7 = pFVar2;
          if (pFVar2 == (FKey *)0x0) {
            pFVar7 = pFVar6;
          }
          sqlite3HashInsert(&pTable->pSchema->fkeyHash,pFVar7->zTo,pFVar2);
        }
        else {
          pFVar6->pPrevTo->pNextTo = pFVar2;
        }
        if (pFVar6->pNextTo != (FKey *)0x0) {
          pFVar6->pNextTo->pPrevTo = pFVar6->pPrevTo;
        }
      }
      fkTriggerDelete(db,pFVar6->apTrigger[0]);
      fkTriggerDelete(db,pFVar6->apTrigger[1]);
      pFVar2 = pFVar6->pNextFrom;
      sqlite3DbFreeNN(db,pFVar6);
      pFVar6 = pFVar2;
    }
  }
  else {
    p_01 = (pTable->u).view.pSelect;
    if (p_01 != (Select *)0x0) {
      clearSelect(db,p_01,1);
    }
  }
  sqlite3DeleteColumnNames(db,pTable);
  if (pTable->zName != (char *)0x0) {
    sqlite3DbFreeNN(db,pTable->zName);
  }
  if (pTable->zColAff != (char *)0x0) {
    sqlite3DbFreeNN(db,pTable->zColAff);
  }
  if (pTable->pCheck != (ExprList *)0x0) {
    exprListDeleteNN(db,pTable->pCheck);
  }
  sqlite3DbFreeNN(db,pTable);
  return;
}

Assistant:

static void SQLITE_NOINLINE deleteTable(sqlite3 *db, Table *pTable){
  Index *pIndex, *pNext;

#ifdef SQLITE_DEBUG
  /* Record the number of outstanding lookaside allocations in schema Tables
  ** prior to doing any free() operations. Since schema Tables do not use
  ** lookaside, this number should not change.
  **
  ** If malloc has already failed, it may be that it failed while allocating
  ** a Table object that was going to be marked ephemeral. So do not check
  ** that no lookaside memory is used in this case either. */
  int nLookaside = 0;
  if( db && !db->mallocFailed && (pTable->tabFlags & TF_Ephemeral)==0 ){
    nLookaside = sqlite3LookasideUsed(db, 0);
  }
#endif

  /* Delete all indices associated with this table. */
  for(pIndex = pTable->pIndex; pIndex; pIndex=pNext){
    pNext = pIndex->pNext;
    assert( pIndex->pSchema==pTable->pSchema
         || (IsVirtual(pTable) && pIndex->idxType!=SQLITE_IDXTYPE_APPDEF) );
    if( (db==0 || db->pnBytesFreed==0) && !IsVirtual(pTable) ){
      char *zName = pIndex->zName;
      TESTONLY ( Index *pOld = ) sqlite3HashInsert(
         &pIndex->pSchema->idxHash, zName, 0
      );
      assert( db==0 || sqlite3SchemaMutexHeld(db, 0, pIndex->pSchema) );
      assert( pOld==pIndex || pOld==0 );
    }
    sqlite3FreeIndex(db, pIndex);
  }

  if( IsOrdinaryTable(pTable) ){
    sqlite3FkDelete(db, pTable);
  }
#ifndef SQLITE_OMIT_VIRTUAL_TABLE
  else if( IsVirtual(pTable) ){
    sqlite3VtabClear(db, pTable);
  }
#endif
  else{
    assert( IsView(pTable) );
    sqlite3SelectDelete(db, pTable->u.view.pSelect);
  }